

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::NegativeCompileInterpolationCase::iterate
          (NegativeCompileInterpolationCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  char *__s;
  char *pcVar3;
  ContextType type;
  GLSLVersion version;
  int iVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  char *pcVar8;
  TestLog *pTVar9;
  ostream *poVar10;
  string interpolation;
  char *sourceStrPtr;
  string source;
  Shader shader;
  ostringstream buf;
  char *local_2d8;
  long local_2d0;
  char local_2c8;
  undefined7 uStack_2c7;
  key_type local_2b8;
  string local_298;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  string local_258;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Base_ptr local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_200;
  size_type local_1f8;
  bool local_1e0;
  StringTemplate local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  local_2d8 = &local_2c8;
  local_2d0 = 0;
  local_2c8 = '\0';
  uVar5 = (ulong)this->m_caseType;
  if ((uVar5 < 0xb) && ((ulong)this->m_interpolation < 3)) {
    local_278 = (&PTR_anon_var_dwarf_3a1143_00b2ba48)[uVar5];
    local_268 = (&PTR_anon_var_dwarf_3a112b_00b2baa0)[uVar5];
    local_270 = *(char **)(&DAT_00b2baf8 + uVar5 * 8);
    pcVar8 = (&PTR_anon_var_dwarf_3a1137_00b2bb50)[uVar5];
    local_260 = *(char **)(&DAT_00b2bba8 + uVar5 * 8);
    __s = (&PTR_anon_var_dwarf_3a1293_00b2bc00)[this->m_interpolation];
    local_228._8_8_ = local_238 + 8;
    local_238._8_4_ = _S_red;
    local_228._M_allocated_capacity = 0;
    local_210._M_allocated_capacity = 0;
    paVar1 = &local_2b8.field_2;
    local_2b8.field_2._M_allocated_capacity._0_4_ = 0x47524154;
    local_2b8.field_2._M_local_buf[4] = 'E';
    local_2b8.field_2._M_local_buf[5] = 'T';
    local_2b8._M_string_length = 6;
    local_2b8.field_2._M_local_buf[6] = '\0';
    local_2b8._M_dataplus._M_p = (pointer)paVar1;
    local_218 = (_Base_ptr)local_228._8_8_;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_238,&local_2b8);
    pcVar3 = (char *)pmVar6->_M_string_length;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)pmVar6,0,pcVar3,(ulong)pcVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      CONCAT17(local_2b8.field_2._M_local_buf[7],
                               CONCAT16(local_2b8.field_2._M_local_buf[6],
                                        CONCAT15(local_2b8.field_2._M_local_buf[5],
                                                 CONCAT14(local_2b8.field_2._M_local_buf[4],
                                                          local_2b8.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    local_2b8.field_2._M_allocated_capacity._0_4_ = 0x54534f50;
    local_2b8.field_2._M_local_buf[4] = '_';
    local_2b8.field_2._M_local_buf[5] = 'S';
    local_2b8.field_2._M_local_buf[6] = 'E';
    local_2b8.field_2._M_local_buf[7] = 'L';
    local_2b8.field_2._8_5_ = 0x524f544345;
    local_2b8._M_string_length = 0xd;
    local_2b8.field_2._M_local_buf[0xd] = '\0';
    local_2b8._M_dataplus._M_p = (pointer)paVar1;
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_238,&local_2b8);
    pcVar3 = local_260;
    pcVar8 = (char *)pmVar6->_M_string_length;
    strlen(local_260);
    std::__cxx11::string::_M_replace((ulong)pmVar6,0,pcVar8,(ulong)pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      CONCAT17(local_2b8.field_2._M_local_buf[7],
                               CONCAT16(local_2b8.field_2._M_local_buf[6],
                                        CONCAT15(local_2b8.field_2._M_local_buf[5],
                                                 CONCAT14(local_2b8.field_2._M_local_buf[4],
                                                          local_2b8.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    sVar7 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,__s,__s + sVar7);
    tcu::StringTemplate::StringTemplate(&local_1d0,&local_258);
    tcu::StringTemplate::specialize
              (&local_2b8,&local_1d0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_238);
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      CONCAT17(local_2b8.field_2._M_local_buf[7],
                               CONCAT16(local_2b8.field_2._M_local_buf[6],
                                        CONCAT15(local_2b8.field_2._M_local_buf[5],
                                                 CONCAT14(local_2b8.field_2._M_local_buf[4],
                                                          local_2b8.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    tcu::StringTemplate::~StringTemplate(&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_238);
    type.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    version = glu::getContextTypeGLSLVersion(type);
    pcVar8 = glu::getGLSLVersionDeclaration(version);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)&local_2d8 + (int)((TestLog *)(local_1b0._0_8_ + -0x18))->m_log + 0x128);
    }
    else {
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,pcVar8,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}",0x2c);
    pcVar8 = local_268;
    sVar7 = strlen(local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,pcVar8,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,
               "layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n",0x44);
    pcVar8 = local_270;
    sVar7 = strlen(local_270);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,pcVar8,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,"\tfragColor = vec4(",0x12);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b0,local_2d8,local_2d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"); // ",6);
    pcVar8 = local_278;
    sVar7 = strlen(local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n}\n",3);
    std::__cxx11::stringbuf::str();
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    local_2b8._M_dataplus._M_p._0_4_ = iVar4;
    specializeShader(&local_298,(string *)local_238,(ContextType *)&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._0_8_ != &local_228) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
    }
  }
  else {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_298._M_string_length = 0;
    local_298.field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  glu::Shader::Shader((Shader *)local_238,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_FRAGMENT);
  local_2b8._M_dataplus._M_p = local_298._M_dataplus._M_p;
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Fragment shader source:",0x17);
  pTVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_2d8 = &local_2c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_298._M_dataplus._M_p,
             local_298._M_dataplus._M_p + local_298._M_string_length);
  tcu::TestLog::writeKernelSource(pTVar9,local_2d8);
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  glu::Shader::setSources((Shader *)local_238,1,(char **)&local_2b8,(int *)0x0);
  glu::Shader::compile((Shader *)local_238);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Info log:",9);
  pTVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_2d8 = &local_2c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_200._M_p,local_200._M_p + local_1f8);
  tcu::TestLog::writeKernelSource(pTVar9,local_2d8);
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (local_1e0 != true) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Compile failed as expected.",0x1b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    pcVar8 = "Pass";
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"ERROR: Illegal shader compiled successfully.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    pcVar8 = "Unexpected compile status";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(local_1e0 == true),pcVar8);
  glu::Shader::~Shader((Shader *)local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  return STOP;
}

Assistant:

NegativeCompileInterpolationCase::IterateResult NegativeCompileInterpolationCase::iterate (void)
{
	const std::string	source			= genShaderSource();
	glu::Shader			shader			(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);
	const char* const	sourceStrPtr	= source.c_str();

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Fragment shader source:"
						<< tcu::TestLog::EndMessage
						<< tcu::TestLog::KernelSource(source);

	shader.setSources(1, &sourceStrPtr, DE_NULL);
	shader.compile();

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Info log:"
						<< tcu::TestLog::EndMessage
						<< tcu::TestLog::KernelSource(shader.getInfoLog());

	if (shader.getCompileStatus())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Illegal shader compiled successfully." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected compile status");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Compile failed as expected." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	return STOP;
}